

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

Location * __thiscall
c4::yml::Parser::location(Location *__return_storage_ptr__,Parser *this,ConstNodeRef node)

{
  code *pcVar1;
  Location LVar2;
  bool bVar3;
  Location *pLVar4;
  char msg [29];
  char local_48 [40];
  
  if (node.m_tree == (Tree *)0x0 || node.m_id == 0xffffffffffffffff) {
    builtin_strncpy(local_48 + 0x10,"ode.valid())",0xd);
    builtin_strncpy(local_48,"check failed: (n",0x10);
    if ((s_error_flags & 1) != 0) {
      bVar3 = is_debugger_attached();
      if (bVar3) {
        pcVar1 = (code *)swi(3);
        pLVar4 = (Location *)(*pcVar1)();
        return pLVar4;
      }
    }
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x7f94) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x7f94) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_48,0x1d,LVar2,(this->m_stack).m_callbacks.m_user_data);
  }
  location(__return_storage_ptr__,this,node.m_tree,node.m_id);
  return __return_storage_ptr__;
}

Assistant:

Location Parser::location(ConstNodeRef node) const
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, node.valid());
    return location(*node.tree(), node.id());
}